

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_node.c
# Opt level: O0

void signal_node_msg(signal_node_t *node,uint msg)

{
  int in_ESI;
  undefined4 *in_RDI;
  
  if (in_RDI == (undefined4 *)0x0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/signal_node.c"
                  ,0xe3,"node");
  }
  if (in_ESI == 0) {
    *in_RDI = 0;
  }
  else {
    if (in_ESI != 1) {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/signal_node.c"
                    ,0xed,"0 == \"Bad signal_node_t message.\"");
    }
    *in_RDI = 1;
    signal_cilk_semaphore((cilk_semaphore_t *)0x117b68);
  }
  return;
}

Assistant:

void signal_node_msg(signal_node_t *node, unsigned int msg)
{
    CILK_ASSERT(node);
    switch (msg) {
    case 0:                    // worker should go to sleep.
        node->run = msg;
        break;
    case 1:                    // worker should be awake.
        node->run = msg;
        signal_cilk_semaphore(&node->sem);
        break;
    default:                   // error.
        CILK_ASSERT(0 == "Bad signal_node_t message.");
    }
}